

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O0

void __thiscall cubeb_run_volume_test_short_Test::TestBody(cubeb_run_volume_test_short_Test *this)

{
  bool bVar1;
  uint uVar2;
  char *message;
  AssertionResult gtest_ar;
  int in_stack_00000118;
  AssertHelper in_stack_ffffffffffffffd0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  char *in_stack_ffffffffffffffe8;
  
  uVar2 = run_volume_test(in_stack_00000118);
  uVar3 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (in_stack_ffffffffffffffe8,(char *)((ulong)uVar2 << 0x20),
             (int *)in_stack_ffffffffffffffd8.ptr_,(anon_enum_32 *)in_stack_ffffffffffffffd0.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar2,uVar3));
    message = testing::AssertionResult::failure_message((AssertionResult *)0x134f84);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_audio.cpp"
               ,0xd3,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    testing::Message::~Message((Message *)0x134fc5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x134fe1);
  return;
}

Assistant:

TEST(cubeb, run_volume_test_short)
{
  ASSERT_EQ(run_volume_test(0), CUBEB_OK);
}